

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O2

Oop __thiscall Lodtalk::VMContext::getGlobalFromName(VMContext *this,char *name)

{
  Oop symbol;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  symbol = ByteSymbol::fromNative(this,&local_30);
  aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)getGlobalFromSymbol(this,symbol);
  std::__cxx11::string::~string((string *)&local_30);
  return (Oop)aVar1.pointer;
}

Assistant:

Oop VMContext::getGlobalFromName(const char *name)
{
	return getGlobalFromSymbol(makeByteSymbol(name));
}